

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O3

llmsset_t llmsset_create(size_t initial_size,size_t max_size)

{
  int iVar1;
  llmsset_t plVar2;
  uint64_t *puVar3;
  undefined4 extraout_var;
  undefined8 *__addr;
  uint64_t *puVar4;
  Task local_58;
  
  __addr = (undefined8 *)0x0;
  plVar2 = (llmsset_t)mmap((void *)0x0,0x80,3,0x22,-1,0);
  if ((undefined1 *)((long)&plVar2->table + 1U) < (undefined1 *)0x2) {
LAB_0012c587:
    llmsset_create_cold_1();
LAB_0012c58c:
    llmsset_create_cold_2();
LAB_0012c591:
    llmsset_create_cold_3();
  }
  else {
    if ((int)POPCOUNT(initial_size) != 1) goto LAB_0012c58c;
    if ((int)POPCOUNT(max_size) != 1) goto LAB_0012c591;
    if (initial_size <= max_size) {
      if (initial_size < 0x200) goto LAB_0012c59b;
      plVar2->max_size = max_size;
      plVar2->table_size = initial_size;
      puVar4 = (uint64_t *)0x0;
      plVar2->mask = initial_size - 1;
      LOCK();
      plVar2->threshold = (short)LZCOUNT(initial_size) * -2 + 0xc0;
      UNLOCK();
      puVar3 = (uint64_t *)mmap((void *)0x0,max_size * 8 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (puVar3 == (uint64_t *)0xffffffffffffffff) {
        puVar3 = puVar4;
      }
      plVar2->table = puVar3;
      puVar3 = (uint64_t *)
               mmap((void *)0x0,plVar2->max_size * 0x10 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (puVar3 == (uint64_t *)0xffffffffffffffff) {
        puVar3 = puVar4;
      }
      plVar2->data = (uint8_t *)puVar3;
      puVar3 = (uint64_t *)
               mmap((void *)0x0,(plVar2->max_size >> 0xc) + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (puVar3 == (uint64_t *)0xffffffffffffffff) {
        puVar3 = puVar4;
      }
      plVar2->bitmap1 = puVar3;
      puVar3 = (uint64_t *)
               mmap((void *)0x0,(plVar2->max_size >> 3) + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (puVar3 == (uint64_t *)0xffffffffffffffff) {
        puVar3 = puVar4;
      }
      __addr = (undefined8 *)0x0;
      plVar2->bitmap2 = puVar3;
      puVar3 = (uint64_t *)
               mmap((void *)0x0,(plVar2->max_size >> 3) + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (puVar3 == (uint64_t *)0xffffffffffffffff) {
        puVar3 = puVar4;
      }
      plVar2->bitmapc = puVar3;
      if ((((plVar2->table != (uint64_t *)0x0) && (plVar2->data != (uint8_t *)0x0)) &&
          (plVar2->bitmap1 != (uint64_t *)0x0)) &&
         ((plVar2->bitmap2 != (uint64_t *)0x0 && (puVar3 != (uint64_t *)0x0)))) {
        LOCK();
        *plVar2->bitmap2 = 0xc000000000000000;
        UNLOCK();
        plVar2->hash_cb = (llmsset_hash_cb)0x0;
        plVar2->equals_cb = (llmsset_equals_cb)0x0;
        plVar2->create_cb = (llmsset_create_cb)0x0;
        plVar2->destroy_cb = (llmsset_destroy_cb)0x0;
        local_58.f = llmsset_reset_region_WRAP;
        local_58.thief = (_Worker *)0x1;
        lace_run_together(&local_58);
        sylvan_init_hash();
        return plVar2;
      }
      llmsset_create_cold_4();
      goto LAB_0012c587;
    }
  }
  llmsset_create_cold_6();
LAB_0012c59b:
  llmsset_create_cold_5();
  munmap((void *)*__addr,__addr[5] * 8 + 0x3fU & 0xffffffffffffffc0);
  munmap((void *)__addr[1],__addr[5] * 0x10 + 0x3fU & 0xffffffffffffffc0);
  munmap((void *)__addr[2],((ulong)__addr[5] >> 0xc) + 0x3f & 0xffffffffffffffc0);
  munmap((void *)__addr[3],((ulong)__addr[5] >> 3) + 0x3f & 0xffffffffffffffc0);
  munmap((void *)__addr[4],((ulong)__addr[5] >> 3) + 0x3f & 0xffffffffffffffc0);
  iVar1 = munmap(__addr,0x80);
  return (llmsset_t)CONCAT44(extraout_var,iVar1);
}

Assistant:

llmsset_t
llmsset_create(size_t initial_size, size_t max_size)
{
    llmsset_t dbs = alloc_aligned(sizeof(struct llmsset));
    if (dbs == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if LLMSSET_MASK
    /* Check if initial_size and max_size are powers of 2 */
    if (__builtin_popcountll(initial_size) != 1) {
        fprintf(stderr, "llmsset_create: initial_size is not a power of 2!\n");
        exit(1);
    }

    if (__builtin_popcountll(max_size) != 1) {
        fprintf(stderr, "llmsset_create: max_size is not a power of 2!\n");
        exit(1);
    }
#endif

    if (initial_size > max_size) {
        fprintf(stderr, "llmsset_create: initial_size > max_size!\n");
        exit(1);
    }

    // minimum size is now 512 buckets (region size, but of course, n_workers * 512 is suggested as minimum)

    if (initial_size < 512) {
        fprintf(stderr, "llmsset_create: initial_size too small!\n");
        exit(1);
    }

    dbs->max_size = max_size;
    llmsset_set_size(dbs, initial_size);

    /* This implementation of "resizable hash table" allocates the max_size table in virtual memory,
       but only uses the "actual size" part in real memory */

    dbs->table = (_Atomic(uint64_t)*) alloc_aligned(dbs->max_size * 8);
    dbs->data = (uint8_t*) alloc_aligned(dbs->max_size * 16);

    /* Also allocate bitmaps. Each region is 64*8 = 512 buckets.
       Overhead of bitmap1: 1 bit per 4096 bucket.
       Overhead of bitmap2: 1 bit per bucket.
       Overhead of bitmapc: 1 bit per bucket. */

    dbs->bitmap1 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / (512*8));
    dbs->bitmap2 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / 8);
    dbs->bitmapc = (uint64_t*)alloc_aligned(dbs->max_size / 8);

    if (dbs->table == 0 || dbs->data == 0 || dbs->bitmap1 == 0 || dbs->bitmap2 == 0 || dbs->bitmapc == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if defined(madvise) && defined(MADV_RANDOM)
    madvise(dbs->table, dbs->max_size * 8, MADV_RANDOM);
#endif

    // forbid first two positions (index 0 and 1)
    dbs->bitmap2[0] = 0xc000000000000000LL;

    dbs->hash_cb = NULL;
    dbs->equals_cb = NULL;
    dbs->create_cb = NULL;
    dbs->destroy_cb = NULL;

    // yes, ugly. for now, we use a global thread-local value.
    // that is a problem with multiple tables.
    // so, for now, do NOT use multiple tables!!

    INIT_THREAD_LOCAL(my_region);
    TOGETHER(llmsset_reset_region);

    // initialize hashtab
    sylvan_init_hash();

    return dbs;
}